

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool is_identifier(char *s,qsizetype len)

{
  long in_RSI;
  _func_bool_char *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (in_RSI < 1) {
    bVar1 = false;
  }
  else {
    bVar1 = std::all_of<char_const*,bool(*)(char)>
                      ((char *)len,
                       (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI)
    ;
  }
  return bVar1;
}

Assistant:

inline bool is_identifier(const char *s, qsizetype len)
{
    if (len < 1)
        return false;
    return std::all_of(s, s + len, is_ident_char);
}